

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

MPP_RET mpi_encode_put_frame(MppCtx ctx,MppFrame frame)

{
  MpiImpl *p;
  MPP_RET ret;
  MppFrame frame_local;
  MppCtx ctx_local;
  
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","enter ctx %p frame %p\n","mpi_encode_put_frame",ctx,frame);
  }
  p._4_4_ = _check_mpp_ctx((MpiImpl *)ctx,"mpi_encode_put_frame");
  if (p._4_4_ == MPP_OK) {
    if (frame == (MppFrame)0x0) {
      _mpp_log_l(2,"mpi","found NULL input frame\n","mpi_encode_put_frame");
      p._4_4_ = MPP_ERR_NULL_PTR;
    }
    else {
      p._4_4_ = Mpp::put_frame(*(Mpp **)((long)ctx + 0x18),frame);
    }
  }
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","leave ctx %p ret %d\n","mpi_encode_put_frame",ctx,(ulong)(uint)p._4_4_);
  }
  return p._4_4_;
}

Assistant:

static MPP_RET mpi_encode_put_frame(MppCtx ctx, MppFrame frame)
{
    MPP_RET ret = MPP_NOK;
    MpiImpl *p = (MpiImpl *)ctx;

    mpi_dbg_func("enter ctx %p frame %p\n", ctx, frame);
    do {
        ret = check_mpp_ctx(p);
        if (ret)
            break;

        if (NULL == frame) {
            mpp_err_f("found NULL input frame\n");
            ret = MPP_ERR_NULL_PTR;
            break;
        }

        ret = p->ctx->put_frame(frame);
    } while (0);

    mpi_dbg_func("leave ctx %p ret %d\n", ctx, ret);
    return ret;
}